

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cencode.c
# Opt level: O3

int base64_encode_blockend(char *code_out,base64_encodestate *state_in)

{
  long lVar1;
  char cVar2;
  char *pcVar3;
  int iVar4;
  char *codechar;
  
  iVar4 = (int)code_out;
  if (state_in->step == step_C) {
    cVar2 = '=';
    if ((long)state_in->result < 0x40) {
      cVar2 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"[state_in->result];
    }
    pcVar3 = code_out + 1;
    *code_out = cVar2;
    lVar1 = 2;
  }
  else {
    if (state_in->step != step_B) goto LAB_00113c48;
    cVar2 = '=';
    if ((long)state_in->result < 0x40) {
      cVar2 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"[state_in->result];
    }
    *code_out = cVar2;
    pcVar3 = code_out + 2;
    code_out[1] = '=';
    lVar1 = 3;
  }
  code_out = code_out + lVar1;
  *pcVar3 = '=';
LAB_00113c48:
  *code_out = '\n';
  return ((int)code_out - iVar4) + 1;
}

Assistant:

int base64_encode_blockend(char* code_out, base64_encodestate* state_in)
{
	char* codechar = code_out;
	
	switch (state_in->step)
	{
	case step_B:
		*codechar++ = base64url_encode_value(state_in->result);
		*codechar++ = '=';
		*codechar++ = '=';
		break;
	case step_C:
		*codechar++ = base64url_encode_value(state_in->result);
		*codechar++ = '=';
		break;
	case step_A:
		break;
	}
	*codechar++ = '\n';
	
	return codechar - code_out;
}